

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t
calc_init_data_size(apx_portInstance_t *port_list,apx_size_t num_ports,apx_size_t *total_size)

{
  uint32_t uVar1;
  uint local_2c;
  apx_size_t data_size;
  apx_size_t port_id;
  apx_size_t *total_size_local;
  apx_size_t num_ports_local;
  apx_portInstance_t *port_list_local;
  
  if ((port_list == (apx_portInstance_t *)0x0) || (num_ports == 0)) {
    port_list_local._4_4_ = 1;
  }
  else {
    *total_size = 0;
    for (local_2c = 0; local_2c < num_ports; local_2c = local_2c + 1) {
      uVar1 = apx_portInstance_data_size(port_list + local_2c);
      if (uVar1 == 0) {
        __assert_fail("data_size > 0u",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                      ,0x463,
                      "apx_error_t calc_init_data_size(apx_portInstance_t *, apx_size_t, apx_size_t *)"
                     );
      }
      *total_size = uVar1 + *total_size;
    }
    port_list_local._4_4_ = 0;
  }
  return port_list_local._4_4_;
}

Assistant:

static apx_error_t calc_init_data_size(apx_portInstance_t* port_list, apx_size_t num_ports, apx_size_t* total_size)
{
   if ((port_list == NULL) || (num_ports == 0))
   {
      return APX_INVALID_ARGUMENT_ERROR;
   }
   *total_size = 0u;
   for (apx_size_t port_id = 0u; port_id < num_ports; port_id++)
   {
      apx_size_t data_size = apx_portInstance_data_size(&port_list[port_id]);
      assert(data_size > 0u);
      *total_size += data_size;
   }
   return APX_NO_ERROR;
}